

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_0::ModuleAnalyzer::ModuleAnalyzer
          (ModuleAnalyzer *this,Module *module,
          function<bool_(wasm::Name,_wasm::Name)> *canImportChangeState,bool canIndirectChangeState,
          Split *removeListInput,Split *addListInput,Split *onlyListInput,bool asserts,bool verbose)

{
  pointer this_00;
  function<bool_(wasm::Name,_wasm::Name)> *wasm;
  bool bVar1;
  _Invoker_type *pp_Var2;
  reference this_01;
  mapped_type *pmVar3;
  Fatal *this_02;
  type *ptVar4;
  reference ppVar5;
  type *ppFVar6;
  reference ppFVar7;
  reference ppFVar8;
  reference pNVar9;
  pointer pFVar10;
  ostream *poVar11;
  function<bool_(wasm::Name,_wasm::Name)> *pfVar12;
  function<void_(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&,_wasm::Function_*)>
  *addProperty;
  Name name_00;
  Name name_01;
  Name name_02;
  pointer local_7f8;
  mapped_type *local_7f0;
  mapped_type *info_3;
  char *pcStack_7e0;
  reference local_7d8;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_4;
  iterator __end3_3;
  iterator __begin3_3;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range3_3;
  pointer pFStack_790;
  bool matched;
  mapped_type *local_788;
  mapped_type *info_2;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_3;
  iterator __end3_2;
  iterator __begin3_2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range3_2;
  function<void_(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&,_wasm::Function_*)> local_758;
  anon_class_1_0_00000001 local_731;
  function<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)> local_730;
  anon_class_1_0_00000001 local_709;
  function<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)> local_708;
  size_t local_6e8;
  char *pcStack_6e0;
  size_t sStack_6d8;
  Name name;
  iterator __end2_3;
  iterator __begin2_3;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range2_3;
  Function *target_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *__range3_1;
  Function *target;
  iterator __end3;
  iterator __begin3;
  set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_> *__range3;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> callersToDelete;
  set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_> *callsTo;
  type *info_1;
  type *func_2;
  _Self local_638;
  iterator __end2_2;
  iterator __begin2_2;
  Map *__range2_2;
  vector<wasm::Name,_std::allocator<wasm::Name>_> funcsToDelete;
  type *info;
  type *func_1;
  _Self local_5d0;
  iterator __end2_1;
  iterator __begin2_1;
  Map *__range2_1;
  bool *local_5b0;
  Module *local_5a8;
  bool *local_5a0;
  Func local_598;
  undefined1 local_578 [8];
  CallGraphPropertyAnalysis<wasm::(anonymous_namespace)::ModuleAnalyzer::Info> scanner;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2;
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  renamings;
  string local_360;
  undefined1 local_340 [8];
  PatternMatcher onlyList;
  string local_258;
  undefined1 local_238 [8];
  PatternMatcher addList;
  string local_150;
  undefined1 local_130 [8];
  PatternMatcher removeList;
  bool local_3a;
  byte local_39;
  bool verbose_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_38;
  bool asserts_local;
  Split *addListInput_local;
  Split *removeListInput_local;
  function<bool_(wasm::Name,_wasm::Name)> *pfStack_20;
  bool canIndirectChangeState_local;
  function<bool_(wasm::Name,_wasm::Name)> *canImportChangeState_local;
  Module *module_local;
  ModuleAnalyzer *this_local;
  
  local_39 = asserts;
  local_3a = verbose;
  this->module = module;
  this->canIndirectChangeState = canIndirectChangeState;
  pvStack_38 = &addListInput->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  addListInput_local = removeListInput;
  removeListInput_local._7_1_ = canIndirectChangeState;
  pfStack_20 = canImportChangeState;
  canImportChangeState_local = (function<bool_(wasm::Name,_wasm::Name)> *)module;
  module_local = (Module *)this;
  std::
  map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
  ::map(&this->map);
  FakeGlobalHelper::FakeGlobalHelper(&this->fakeGlobals,(Module *)canImportChangeState_local);
  this->asserts = (bool)(local_39 & 1);
  this->verbose = (bool)(local_3a & 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"remove",
             (allocator<char> *)
             ((long)&addList.unescaped._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  PatternMatcher::PatternMatcher
            ((PatternMatcher *)local_130,&local_150,(Module *)canImportChangeState_local,
             addListInput_local);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&addList.unescaped._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"add",
             (allocator<char> *)
             ((long)&onlyList.unescaped._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  PatternMatcher::PatternMatcher
            ((PatternMatcher *)local_238,&local_258,(Module *)canImportChangeState_local,
             (Split *)pvStack_38);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&onlyList.unescaped._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"only",
             (allocator<char> *)
             ((long)&renamings._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  PatternMatcher::PatternMatcher
            ((PatternMatcher *)local_340,&local_360,(Module *)canImportChangeState_local,
             onlyListInput);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&renamings._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::map((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
         *)&__range2);
  pp_Var2 = &canImportChangeState_local->_M_invoker;
  __end2 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    *)pp_Var2);
  func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::end((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                *)pp_Var2);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                *)&func);
    if (!bVar1) {
      wasm::ModuleUtils::
      renameFunctions<std::map<wasm::Name,wasm::Name,std::less<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>
                ((Module *)canImportChangeState_local,
                 (map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                  *)&__range2);
      wasm = canImportChangeState_local;
      local_5b0 = &local_3a;
      local_5a8 = (Module *)canImportChangeState_local;
      local_5a0 = (bool *)((long)&removeListInput_local + 7);
      pfVar12 = canImportChangeState_local;
      __range2_1 = (Map *)canImportChangeState;
      std::function<void(wasm::Function*,wasm::(anonymous_namespace)::ModuleAnalyzer::Info&)>::
      function<wasm::(anonymous_namespace)::ModuleAnalyzer::function(wasm::Module&,std::function<bool(wasm::Name,wasm::Name)>,bool,wasm::String::Split_const&,wasm::String::Split_const&,wasm::String::Split_const&,bool,bool)::_lambda(wasm::Function*,wasm::(anonymous_namespace)::ModuleAnalyzer::Info&)_1_,void>
                ((function<void(wasm::Function*,wasm::(anonymous_namespace)::ModuleAnalyzer::Info&)>
                  *)&local_598,(anon_class_32_4_cfe57310 *)&__range2_1);
      wasm::ModuleUtils::
      CallGraphPropertyAnalysis<wasm::(anonymous_namespace)::ModuleAnalyzer::Info>::
      CallGraphPropertyAnalysis
                ((CallGraphPropertyAnalysis<wasm::(anonymous_namespace)::ModuleAnalyzer::Info> *)
                 local_578,(Module *)wasm,&local_598);
      std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>::
      ~function(&local_598);
      __end2_1 = std::
                 map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                 ::begin((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                          *)&scanner);
      local_5d0._M_node =
           (_Base_ptr)
           std::
           map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
           ::end((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                  *)&scanner);
      while (bVar1 = std::operator!=(&__end2_1,&local_5d0), bVar1) {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>
                 ::operator*(&__end2_1);
        ppFVar6 = std::
                  get<0ul,wasm::Function*const,wasm::(anonymous_namespace)::ModuleAnalyzer::Info>
                            (ppVar5);
        ptVar4 = std::
                 get<1ul,wasm::Function*const,wasm::(anonymous_namespace)::ModuleAnalyzer::Info>
                           (ppVar5);
        bVar1 = PatternMatcher::match
                          ((PatternMatcher *)local_130,
                           (Name)((*ppFVar6)->super_Importable).super_Named.name.super_IString.str);
        if (bVar1) {
          ptVar4->inRemoveList = true;
          if (((local_3a & 1U) != 0) && ((ptVar4->canChangeState & 1U) != 0)) {
            poVar11 = std::operator<<((ostream *)&std::cout,"[asyncify] ");
            funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)((*ppFVar6)->super_Importable).super_Named.name.super_IString.str._M_len;
            name_00.super_IString.str._M_str = (char *)pfVar12;
            name_00.super_IString.str._M_len =
                 (size_t)((*ppFVar6)->super_Importable).super_Named.name.super_IString.str._M_str;
            poVar11 = wasm::operator<<((wasm *)poVar11,
                                       (ostream *)
                                       funcsToDelete.
                                       super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage,name_00);
            std::operator<<(poVar11," is in the remove-list, ignore\n");
          }
          ptVar4->canChangeState = false;
        }
        std::
        _Rb_tree_iterator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>
        ::operator++(&__end2_1);
      }
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2_2);
      __end2_2 = std::
                 map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                 ::begin((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                          *)&scanner);
      local_638._M_node =
           (_Base_ptr)
           std::
           map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
           ::end((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                  *)&scanner);
      while (bVar1 = std::operator!=(&__end2_2,&local_638), bVar1) {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>
                 ::operator*(&__end2_2);
        ppFVar6 = std::
                  get<0ul,wasm::Function*const,wasm::(anonymous_namespace)::ModuleAnalyzer::Info>
                            (ppVar5);
        callersToDelete.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      get<1ul,wasm::Function*const,wasm::(anonymous_namespace)::ModuleAnalyzer::Info>
                                (ppVar5);
        bVar1 = Importable::imported(&(*ppFVar6)->super_Importable);
        if ((bVar1) &&
           (bVar1 = IString::operator==(&((*ppFVar6)->super_Importable).module.super_IString,
                                        (IString *)wasm::(anonymous_namespace)::ASYNCIFY), bVar1)) {
          std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                    ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2_2,
                     (value_type *)*ppFVar6);
        }
        std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                  ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range3);
        this_00 = callersToDelete.
                  super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        __end3 = std::
                 set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                 ::begin((set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                          *)callersToDelete.
                            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        target = (Function *)
                 std::
                 set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                 ::end((set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                        *)this_00);
        while (bVar1 = std::operator!=(&__end3,(_Self *)&target), bVar1) {
          ppFVar7 = std::_Rb_tree_const_iterator<wasm::Function_*>::operator*(&__end3);
          __range3_1 = (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)*ppFVar7;
          bVar1 = Importable::imported((Importable *)__range3_1);
          if ((bVar1) &&
             (bVar1 = IString::operator==((IString *)(__range3_1 + 1),
                                          (IString *)wasm::(anonymous_namespace)::ASYNCIFY), bVar1))
          {
            std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::push_back
                      ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range3,
                       (value_type *)&__range3_1);
          }
          std::_Rb_tree_const_iterator<wasm::Function_*>::operator++(&__end3);
        }
        __end3_1 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::begin
                             ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)
                              &__range3);
        target_1 = (Function *)
                   std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::end
                             ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)
                              &__range3);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3_1,
                                  (__normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                                   *)&target_1), bVar1) {
          ppFVar8 = __gnu_cxx::
                    __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                    ::operator*(&__end3_1);
          __range2_3 = (vector<wasm::Name,_std::allocator<wasm::Name>_> *)*ppFVar8;
          std::set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
          ::erase((set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                   *)callersToDelete.
                     super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage,(key_type *)&__range2_3);
          __gnu_cxx::
          __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
          ::operator++(&__end3_1);
        }
        std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~vector
                  ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range3);
        std::
        _Rb_tree_iterator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>
        ::operator++(&__end2_2);
      }
      __end2_3 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin
                           ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2_2);
      name.super_IString.str._M_str =
           (char *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end
                             ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2_2);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_3,
                                (__normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                 *)&name.super_IString.str._M_str), bVar1) {
        pNVar9 = __gnu_cxx::
                 __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                 ::operator*(&__end2_3);
        local_6e8 = (pNVar9->super_IString).str._M_len;
        pcStack_6e0 = (pNVar9->super_IString).str._M_str;
        sStack_6d8 = local_6e8;
        name.super_IString.str._M_len = (size_t)pcStack_6e0;
        Module::removeFunction
                  ((Module *)canImportChangeState_local,(Name)(pNVar9->super_IString).str);
        __gnu_cxx::
        __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
        operator++(&__end2_3);
      }
      std::function<bool(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_const&)>::
      function<wasm::(anonymous_namespace)::ModuleAnalyzer::function(wasm::Module&,std::function<bool(wasm::Name,wasm::Name)>,bool,wasm::String::Split_const&,wasm::String::Split_const&,wasm::String::Split_const&,bool,bool)::_lambda(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_const&)_1_,void>
                ((function<bool(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_const&)> *)
                 &local_708,&local_709);
      std::function<bool(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_const&)>::
      function<wasm::(anonymous_namespace)::ModuleAnalyzer::function(wasm::Module&,std::function<bool(wasm::Name,wasm::Name)>,bool,wasm::String::Split_const&,wasm::String::Split_const&,wasm::String::Split_const&,bool,bool)::_lambda(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_const&)_2_,void>
                ((function<bool(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_const&)> *)
                 &local_730,&local_731);
      __range3_2._7_1_ = local_3a & 1;
      addProperty = &local_758;
      std::function<void(wasm::(anonymous_namespace)::ModuleAnalyzer::Info&,wasm::Function*)>::
      function<wasm::(anonymous_namespace)::ModuleAnalyzer::function(wasm::Module&,std::function<bool(wasm::Name,wasm::Name)>,bool,wasm::String::Split_const&,wasm::String::Split_const&,wasm::String::Split_const&,bool,bool)::_lambda(wasm::(anonymous_namespace)::ModuleAnalyzer::Info&,wasm::Function*)_1_,void>
                ((function<void(wasm::(anonymous_namespace)::ModuleAnalyzer::Info&,wasm::Function*)>
                  *)addProperty,(anon_class_1_1_9847ac62 *)((long)&__range3_2 + 7));
      wasm::ModuleUtils::
      CallGraphPropertyAnalysis<wasm::(anonymous_namespace)::ModuleAnalyzer::Info>::propagateBack
                ((CallGraphPropertyAnalysis<wasm::(anonymous_namespace)::ModuleAnalyzer::Info> *)
                 local_578,&local_708,&local_730,addProperty,IgnoreNonDirectCalls);
      std::function<void_(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&,_wasm::Function_*)>::
      ~function(&local_758);
      std::function<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>::~function
                (&local_730);
      std::function<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>::~function
                (&local_708);
      std::
      map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
      ::swap(&this->map,
             (map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
              *)&scanner);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&onlyListInput->
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     );
      if (!bVar1) {
        pp_Var2 = &canImportChangeState_local->_M_invoker;
        __end3_2 = std::
                   vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ::begin((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            *)pp_Var2);
        func_3 = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                 std::
                 vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ::end((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                        *)pp_Var2);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3_2,
                                  (__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                   *)&func_3), bVar1) {
          info_2 = (mapped_type *)
                   __gnu_cxx::
                   __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                   ::operator*(&__end3_2);
          pFVar10 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                    operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                               info_2);
          bVar1 = Importable::imported(&pFVar10->super_Importable);
          if (!bVar1) {
            pFStack_790 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                                    ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                      *)info_2);
            local_788 = std::
                        map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                        ::operator[](&this->map,&stack0xfffffffffffff870);
            pFVar10 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                      operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *
                                 )info_2);
            bVar1 = PatternMatcher::match
                              ((PatternMatcher *)local_340,
                               (Name)(pFVar10->super_Importable).super_Named.name.super_IString.str)
            ;
            addProperty = (function<void_(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&,_wasm::Function_*)>
                           *)CONCAT71((int7)((ulong)addProperty >> 8),bVar1);
            local_788->canChangeState = bVar1;
            if (bVar1) {
              local_788->addedFromList = true;
            }
            if ((local_3a & 1U) != 0) {
              poVar11 = std::operator<<((ostream *)&std::cout,"[asyncify] ");
              pFVar10 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                        operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                    *)info_2);
              name_01.super_IString.str._M_str = (char *)addProperty;
              name_01.super_IString.str._M_len =
                   (size_t)(pFVar10->super_Importable).super_Named.name.super_IString.str._M_str;
              poVar11 = wasm::operator<<((wasm *)poVar11,
                                         (ostream *)
                                         (pFVar10->super_Importable).super_Named.name.super_IString.
                                         str._M_len,name_01);
              poVar11 = std::operator<<(poVar11,"\'s state is set based on the only-list to ");
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,bVar1);
              std::operator<<(poVar11,'\n');
            }
          }
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
          ::operator++(&__end3_2);
        }
      }
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(pvStack_38);
      if (!bVar1) {
        pp_Var2 = &canImportChangeState_local->_M_invoker;
        __end3_3 = std::
                   vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ::begin((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            *)pp_Var2);
        func_4 = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                 std::
                 vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ::end((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                        *)pp_Var2);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3_3,
                                  (__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                   *)&func_4), bVar1) {
          local_7d8 = __gnu_cxx::
                      __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                      ::operator*(&__end3_3);
          pFVar10 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                    operator->(local_7d8);
          bVar1 = Importable::imported(&pFVar10->super_Importable);
          if (!bVar1) {
            pFVar10 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                      operator->(local_7d8);
            info_3 = (mapped_type *)
                     (pFVar10->super_Importable).super_Named.name.super_IString.str._M_len;
            pcStack_7e0 = (pFVar10->super_Importable).super_Named.name.super_IString.str._M_str;
            bVar1 = PatternMatcher::match
                              ((PatternMatcher *)local_238,
                               (Name)(pFVar10->super_Importable).super_Named.name.super_IString.str)
            ;
            if (bVar1) {
              local_7f8 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                                    (local_7d8);
              local_7f0 = std::
                          map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                          ::operator[](&this->map,&local_7f8);
              if (((local_3a & 1U) != 0) && ((local_7f0->canChangeState & 1U) == 0)) {
                poVar11 = std::operator<<((ostream *)&std::cout,"[asyncify] ");
                pFVar10 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                          operator->(local_7d8);
                name_02.super_IString.str._M_str = (char *)addProperty;
                name_02.super_IString.str._M_len =
                     (size_t)(pFVar10->super_Importable).super_Named.name.super_IString.str._M_str;
                poVar11 = wasm::operator<<((wasm *)poVar11,
                                           (ostream *)
                                           (pFVar10->super_Importable).super_Named.name.
                                           super_IString.str._M_len,name_02);
                std::operator<<(poVar11," is in the add-list, add\n");
              }
              local_7f0->canChangeState = true;
              local_7f0->addedFromList = true;
            }
          }
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
          ::operator++(&__end3_3);
        }
      }
      PatternMatcher::checkPatternsMatches((PatternMatcher *)local_130);
      PatternMatcher::checkPatternsMatches((PatternMatcher *)local_238);
      PatternMatcher::checkPatternsMatches((PatternMatcher *)local_340);
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2_2);
      wasm::ModuleUtils::
      CallGraphPropertyAnalysis<wasm::(anonymous_namespace)::ModuleAnalyzer::Info>::
      ~CallGraphPropertyAnalysis
                ((CallGraphPropertyAnalysis<wasm::(anonymous_namespace)::ModuleAnalyzer::Info> *)
                 local_578);
      std::
      map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
      ::~map((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
              *)&__range2);
      PatternMatcher::~PatternMatcher((PatternMatcher *)local_340);
      PatternMatcher::~PatternMatcher((PatternMatcher *)local_238);
      PatternMatcher::~PatternMatcher((PatternMatcher *)local_130);
      return;
    }
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
              ::operator*(&__end2);
    pFVar10 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                        (this_01);
    bVar1 = IString::operator==(&(pFVar10->super_Importable).module.super_IString,
                                (IString *)wasm::(anonymous_namespace)::ASYNCIFY);
    if (bVar1) {
      pFVar10 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                          (this_01);
      bVar1 = IString::operator==(&(pFVar10->super_Importable).base.super_IString,
                                  (IString *)wasm::(anonymous_namespace)::START_UNWIND);
      if (bVar1) {
        pFVar10 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                            (this_01);
        pmVar3 = std::
                 map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                 ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                               *)&__range2,(key_type *)pFVar10);
        wasm::Name::operator=(pmVar3,(Name *)wasm::(anonymous_namespace)::ASYNCIFY_START_UNWIND);
      }
      else {
        pFVar10 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                            (this_01);
        bVar1 = IString::operator==(&(pFVar10->super_Importable).base.super_IString,
                                    (IString *)wasm::(anonymous_namespace)::STOP_UNWIND);
        if (bVar1) {
          pFVar10 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                    operator->(this_01);
          pmVar3 = std::
                   map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                   ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                 *)&__range2,(key_type *)pFVar10);
          wasm::Name::operator=(pmVar3,(Name *)&wasm::(anonymous_namespace)::ASYNCIFY_STOP_UNWIND);
        }
        else {
          pFVar10 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                    operator->(this_01);
          bVar1 = IString::operator==(&(pFVar10->super_Importable).base.super_IString,
                                      (IString *)wasm::(anonymous_namespace)::START_REWIND);
          if (bVar1) {
            pFVar10 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                      operator->(this_01);
            pmVar3 = std::
                     map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                     ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                   *)&__range2,(key_type *)pFVar10);
            wasm::Name::operator=(pmVar3,(Name *)wasm::(anonymous_namespace)::ASYNCIFY_START_REWIND)
            ;
          }
          else {
            pFVar10 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                      operator->(this_01);
            bVar1 = IString::operator==(&(pFVar10->super_Importable).base.super_IString,
                                        (IString *)wasm::(anonymous_namespace)::STOP_REWIND);
            if (!bVar1) {
              Fatal::Fatal((Fatal *)&scanner.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
              this_02 = Fatal::operator<<((Fatal *)&scanner.map._M_t._M_impl.super__Rb_tree_header.
                                                    _M_node_count,
                                          (char (*) [37])"call to unidenfied asyncify import: ");
              pFVar10 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                        operator->(this_01);
              Fatal::operator<<(this_02,&(pFVar10->super_Importable).base);
              Fatal::~Fatal((Fatal *)&scanner.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
            }
            pFVar10 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                      operator->(this_01);
            pmVar3 = std::
                     map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                     ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                   *)&__range2,(key_type *)pFVar10);
            wasm::Name::operator=(pmVar3,(Name *)wasm::(anonymous_namespace)::ASYNCIFY_STOP_REWIND);
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

ModuleAnalyzer(Module& module,
                 std::function<bool(Name, Name)> canImportChangeState,
                 bool canIndirectChangeState,
                 const String::Split& removeListInput,
                 const String::Split& addListInput,
                 const String::Split& onlyListInput,
                 bool asserts,
                 bool verbose)
    : module(module), canIndirectChangeState(canIndirectChangeState),
      fakeGlobals(module), asserts(asserts), verbose(verbose) {

    PatternMatcher removeList("remove", module, removeListInput);
    PatternMatcher addList("add", module, addListInput);
    PatternMatcher onlyList("only", module, onlyListInput);

    // Rename the asyncify imports so their internal name matches the
    // convention. This makes replacing them with the implementations
    // later easier.
    std::map<Name, Name> renamings;
    for (auto& func : module.functions) {
      if (func->module == ASYNCIFY) {
        if (func->base == START_UNWIND) {
          renamings[func->name] = ASYNCIFY_START_UNWIND;
        } else if (func->base == STOP_UNWIND) {
          renamings[func->name] = ASYNCIFY_STOP_UNWIND;
        } else if (func->base == START_REWIND) {
          renamings[func->name] = ASYNCIFY_START_REWIND;
        } else if (func->base == STOP_REWIND) {
          renamings[func->name] = ASYNCIFY_STOP_REWIND;
        } else {
          Fatal() << "call to unidenfied asyncify import: " << func->base;
        }
      }
    }
    ModuleUtils::renameFunctions(module, renamings);

    // Scan to see which functions can directly change the state.
    // Also handle the asyncify imports, removing them (as we will implement
    // them later), and replace calls to them with calls to the later proper
    // name.
    ModuleUtils::CallGraphPropertyAnalysis<Info> scanner(
      module, [&](Function* func, Info& info) {
        info.name = func->name;
        if (func->imported()) {
          // The relevant asyncify imports can definitely change the state.
          if (func->module == ASYNCIFY &&
              (func->base == START_UNWIND || func->base == STOP_REWIND)) {
            info.canChangeState = true;
          } else {
            info.canChangeState =
              canImportChangeState(func->module, func->base);
            if (verbose && info.canChangeState) {
              std::cout << "[asyncify] " << func->name
                        << " is an import that can change the state\n";
            }
          }
          return;
        }
        struct Walker : PostWalker<Walker> {
          Info& info;
          Module& module;
          bool canIndirectChangeState;

          Walker(Info& info, Module& module, bool canIndirectChangeState)
            : info(info), module(module),
              canIndirectChangeState(canIndirectChangeState) {}

          void visitCall(Call* curr) {
            if (curr->isReturn) {
              Fatal() << "tail calls not yet supported in asyncify";
            }
            auto* target = module.getFunction(curr->target);
            if (target->imported() && target->module == ASYNCIFY) {
              // Redirect the imports to the functions we'll add later.
              if (target->base == START_UNWIND) {
                info.canChangeState = true;
                info.isTopMostRuntime = true;
              } else if (target->base == STOP_UNWIND) {
                info.isBottomMostRuntime = true;
              } else if (target->base == START_REWIND) {
                info.isBottomMostRuntime = true;
              } else if (target->base == STOP_REWIND) {
                info.canChangeState = true;
                info.isTopMostRuntime = true;
              } else {
                WASM_UNREACHABLE("call to unidenfied asyncify import");
              }
            }
          }
          void visitCallIndirect(CallIndirect* curr) {
            if (curr->isReturn) {
              Fatal() << "tail calls not yet supported in asyncify";
            }
            if (canIndirectChangeState) {
              info.canChangeState = true;
            }
            // TODO optimize the other case, at least by type
          }
        };
        Walker walker(info, module, canIndirectChangeState);
        walker.walk(func->body);

        if (info.isBottomMostRuntime) {
          info.canChangeState = false;
          // TODO: issue warnings on suspicious things, like a function in
          //       the bottom-most runtime also doing top-most runtime stuff
          //       like starting and unwinding.
        }
        if (verbose && info.canChangeState) {
          std::cout << "[asyncify] " << func->name
                    << " can change the state due to initial scan\n";
        }
      });

    // Functions in the remove-list are assumed to not change the state.
    for (auto& [func, info] : scanner.map) {
      if (removeList.match(func->name)) {
        info.inRemoveList = true;
        if (verbose && info.canChangeState) {
          std::cout << "[asyncify] " << func->name
                    << " is in the remove-list, ignore\n";
        }
        info.canChangeState = false;
      }
    }

    // Remove the asyncify imports, if any, and any calls to them.
    std::vector<Name> funcsToDelete;
    for (auto& [func, info] : scanner.map) {
      auto& callsTo = info.callsTo;
      if (func->imported() && func->module == ASYNCIFY) {
        funcsToDelete.push_back(func->name);
      }
      std::vector<Function*> callersToDelete;
      for (auto* target : callsTo) {
        if (target->imported() && target->module == ASYNCIFY) {
          callersToDelete.push_back(target);
        }
      }
      for (auto* target : callersToDelete) {
        callsTo.erase(target);
      }
    }
    for (auto name : funcsToDelete) {
      module.removeFunction(name);
    }

    scanner.propagateBack([](const Info& info) { return info.canChangeState; },
                          [](const Info& info) {
                            return !info.isBottomMostRuntime &&
                                   !info.inRemoveList;
                          },
                          [verbose](Info& info, Function* reason) {
                            if (verbose && !info.canChangeState) {
                              std::cout << "[asyncify] " << info.name
                                        << " can change the state due to "
                                        << reason->name << "\n";
                            }
                            info.canChangeState = true;
                          },
                          scanner.IgnoreNonDirectCalls);

    map.swap(scanner.map);

    if (!onlyListInput.empty()) {
      // Only the functions in the only-list can change the state.
      for (auto& func : module.functions) {
        if (!func->imported()) {
          auto& info = map[func.get()];
          bool matched = onlyList.match(func->name);
          info.canChangeState = matched;
          if (matched) {
            info.addedFromList = true;
          }
          if (verbose) {
            std::cout << "[asyncify] " << func->name
                      << "'s state is set based on the only-list to " << matched
                      << '\n';
          }
        }
      }
    }

    if (!addListInput.empty()) {
      for (auto& func : module.functions) {
        if (!func->imported() && addList.match(func->name)) {
          auto& info = map[func.get()];
          if (verbose && !info.canChangeState) {
            std::cout << "[asyncify] " << func->name
                      << " is in the add-list, add\n";
          }
          info.canChangeState = true;
          info.addedFromList = true;
        }
      }
    }

    removeList.checkPatternsMatches();
    addList.checkPatternsMatches();
    onlyList.checkPatternsMatches();
  }